

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

void __thiscall Quest_Context::UsedItem(Quest_Context *this,short id)

{
  bool bVar1;
  mapped_type *pmVar2;
  int subject;
  int subject_00;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  anon_class_4_2_d6bdf07c local_104;
  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)> local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  short local_74;
  anon_class_2_1_3fcf65d9 local_72;
  undefined1 local_70 [4];
  short amount;
  allocator<char> local_39;
  string local_38;
  undefined1 local_13;
  short local_12;
  bool check;
  Quest_Context *pQStack_10;
  short id_local;
  Quest_Context *this_local;
  
  local_12 = id;
  pQStack_10 = this;
  bVar1 = Quest::Disabled(this->quest);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"useditem",&local_39);
    local_72.id = local_12;
    std::function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)>::
    function<Quest_Context::UsedItem(short)::__0,void>
              ((function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)> *)
               local_70,&local_72);
    bVar1 = EOPlus::Context::QueryRule
                      (&this->super_Context,&local_38,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)local_70);
    std::function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>::
    ~function((function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)> *)
              local_70);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    local_74 = 0;
    local_13 = bVar1;
    if (bVar1) {
      util::to_string_abi_cxx11_(&local_b8,(util *)(ulong)(uint)(int)local_12,subject);
      std::operator+(&local_98,"useditem/",&local_b8);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,&local_98);
      local_74 = *pmVar2 + 1;
      *pmVar2 = local_74;
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"useditem",&local_d9);
    local_104.id = local_12;
    local_104.amount = local_74;
    std::function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)>::
    function<Quest_Context::UsedItem(short)::__1,void>
              ((function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)> *)
               &local_100,&local_104);
    bVar1 = EOPlus::Context::TriggerRule(&this->super_Context,&local_d8,&local_100);
    std::function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>::
    ~function(&local_100);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    if (bVar1) {
      util::to_string_abi_cxx11_(&local_148,(util *)(ulong)(uint)(int)local_12,subject_00);
      std::operator+(&local_128,"useditem/",&local_148);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::erase(&this->progress,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
    }
  }
  return;
}

Assistant:

void Quest_Context::UsedItem(short id)
{
	if (this->quest->Disabled())
		return;

	bool check = this->QueryRule("useditem", [id](const std::deque<util::variant>& args) { return int(args[0]) == id; });
	short amount = 0;

	if (check)
		amount = ++this->progress["useditem/" + util::to_string(id)];

	if (this->TriggerRule("useditem", [id, amount](const std::deque<util::variant>& args) { return int(args[0]) == id && amount >= int(args[1]); }))
		this->progress.erase("useditem/" + util::to_string(id));
}